

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O3

void __thiscall helics::zeromq::ZmqComms::queue_tx_function(ZmqComms *this)

{
  string *networkInterface;
  ActionMessage *act;
  unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *puVar1;
  bool bVar2;
  socket_base sVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_iterator __first;
  error_t *this_00;
  socklen_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Base_ptr p_Var11;
  undefined1 *puVar12;
  byte *pbVar13;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ActionMessage *command;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  ConnectionStatus status;
  ActionMessage *pAVar14;
  pointer pcVar15;
  context_t *context_;
  pointer pcVar17;
  ulong uVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined8 uVar22;
  socket_t *psVar23;
  int __flags;
  void *in_R8;
  void *pvVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  string_view message;
  string_view message_00;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  pVar25;
  socket_t brokerPushSocket;
  socket_t zsock;
  socket_t controlSocket;
  vector<char,_std::allocator<char>_> buffer;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  interfaceAndPort;
  shared_ptr<ZmqContextManager> ctx;
  string controlsockString;
  map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  routes;
  message_t msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  CommsInterface *local_300;
  socket_t local_2f8;
  string local_2e8;
  socket_t local_2c8;
  vector<char,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [32];
  int local_278;
  ZmqContextManager local_1d8;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_130;
  undefined1 local_128 [32];
  Time TStack_108;
  Time local_100;
  Time TStack_f8;
  Time local_f0;
  byte abStack_e8 [64];
  void *pvStack_a8;
  size_t local_a0;
  byte *local_98;
  undefined8 local_90;
  pointer pbStack_88;
  pointer local_80;
  pointer pbStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [2];
  size_type sVar16;
  
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_298._8_8_ = 0;
  local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
  local_298._0_8_ = local_298 + 0x10;
  ZmqContextManager::getContextPointer(&local_1d8,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  zmq::socket_t::socket_t(&local_2c8,*(context_t **)(local_1d8.name._M_dataplus._M_p + 0x20),0);
  local_298._0_4_ = 200;
  zmq::detail::socket_base::setsockopt
            (&local_2c8.super_socket_base,0x11,(int)local_298,4,in_R8,(socklen_t)in_R9);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inproc://","");
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length)
  ;
  local_70[0]._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p == paVar10) {
    local_70[0].field_2._0_8_ = paVar10->_M_allocated_capacity;
    local_70[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_70[0]._M_dataplus._M_p = (pointer)&local_70[0].field_2;
  }
  else {
    local_70[0].field_2._0_8_ = paVar10->_M_allocated_capacity;
  }
  local_70[0]._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pvVar24 = (void *)0x5f;
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(local_70,local_70[0]._M_string_length,0,1,'_');
  local_128._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ == paVar10) {
    local_128._16_8_ = paVar10->_M_allocated_capacity;
    local_128._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_128._0_8_ = local_128 + 0x10;
  }
  else {
    local_128._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_128._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     (this->super_NetworkCommsInterface).super_CommsInterface.randomID._M_dataplus.
                     _M_p,(this->super_NetworkCommsInterface).super_CommsInterface.randomID.
                          _M_string_length);
  local_298._0_8_ = local_298 + 0x10;
  pcVar17 = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar17 == paVar10) {
    local_298._16_8_ = paVar10->_M_allocated_capacity;
    local_298._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_298._16_8_ = paVar10->_M_allocated_capacity;
    local_298._0_8_ = pcVar17;
  }
  local_298._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                  "_control");
  local_1d8.name.field_2._M_allocated_capacity = (size_type)&local_1d8.zcontext;
  puVar1 = (unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)
           (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar10) {
    local_1d8.zcontext._M_t.
    super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
    super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
    super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<zmq::context_t,_std::default_delete<zmq::context_t>,_true,_true>)
         paVar10->_M_allocated_capacity;
    local_1d8._40_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1d8.zcontext._M_t.
    super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
    super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
    super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<zmq::context_t,_std::default_delete<zmq::context_t>,_true,_true>)
         paVar10->_M_allocated_capacity;
    local_1d8.name.field_2._M_allocated_capacity = (size_type)puVar1;
  }
  __addr = (sockaddr *)pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1d8.name.field_2._8_8_ = __addr;
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    __addr = extraout_RDX;
  }
  sVar9 = (socklen_t)paVar10;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    __addr = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != &local_70[0].field_2) {
    operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
    __addr = extraout_RDX_01;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    __addr = extraout_RDX_02;
  }
  zmq::detail::socket_base::connect
            (&local_2c8.super_socket_base,(int)local_1d8.name.field_2._M_allocated_capacity,__addr,
             sVar9);
  iVar6 = initializeBrokerConnections(this,&local_2c8);
  if (iVar6 < 0) {
    status = (uint)(iVar6 != -3) * 2 + TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,status);
    psVar23 = &local_2c8;
  }
  else {
    zmq::socket_t::socket_t(&local_2f8,*(context_t **)(local_1d8.name._M_dataplus._M_p + 0x20),8);
    local_298._0_4_ = 200;
    zmq::detail::socket_base::setsockopt
              (&local_2f8.super_socket_base,0x11,(int)local_298,4,pvVar24,(socklen_t)in_R9);
    networkInterface = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress
    ;
    p_Var11 = (_Base_ptr)(local_1a8 + 8);
    local_1a8._8_4_ = _S_red;
    local_1a8._16_8_ = (undefined1 *)0x0;
    local_180 = 0;
    local_1a8._24_8_ = p_Var11;
    local_188 = p_Var11;
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      gmlc::networking::makePortAddress
                ((string *)local_298,networkInterface,(this->super_NetworkCommsInterface).brokerPort
                );
      zmq::detail::socket_base::connect
                (&local_2f8.super_socket_base,(int)local_298._0_8_,__addr_00,(socklen_t)p_Var11);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
    }
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                networkInterface;
    zmq_msg_init(local_70);
    local_130 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    local_300 = (CommsInterface *)this;
    do {
      local_128._0_8_ = (pointer)0x0;
      local_128._8_8_ = 0x9aac0f0000000000;
      local_128._16_8_ = 0x9aac0f0000000000;
      abStack_e8[0x38] = 0;
      abStack_e8[0x39] = 0;
      abStack_e8[0x3a] = 0;
      abStack_e8[0x3b] = 0;
      abStack_e8[0x3c] = 0;
      abStack_e8[0x3d] = 0;
      abStack_e8[0x3e] = 0;
      abStack_e8[0x3f] = 0;
      pvStack_a8 = (void *)0x0;
      abStack_e8[0x28] = 0;
      abStack_e8[0x29] = 0;
      abStack_e8[0x2a] = 0;
      abStack_e8[0x2b] = 0;
      abStack_e8[0x2c] = 0;
      abStack_e8[0x2d] = 0;
      abStack_e8[0x2e] = 0;
      abStack_e8[0x2f] = 0;
      abStack_e8[0x30] = 0;
      abStack_e8[0x31] = 0;
      abStack_e8[0x32] = 0;
      abStack_e8[0x33] = 0;
      abStack_e8[0x34] = 0;
      abStack_e8[0x35] = 0;
      abStack_e8[0x36] = 0;
      abStack_e8[0x37] = 0;
      abStack_e8[0x18] = 0;
      abStack_e8[0x19] = 0;
      abStack_e8[0x1a] = 0;
      abStack_e8[0x1b] = 0;
      abStack_e8[0x1c] = 0;
      abStack_e8[0x1d] = 0;
      abStack_e8[0x1e] = 0;
      abStack_e8[0x1f] = 0;
      abStack_e8[0x20] = 0;
      abStack_e8[0x21] = 0;
      abStack_e8[0x22] = 0;
      abStack_e8[0x23] = 0;
      abStack_e8[0x24] = 0;
      abStack_e8[0x25] = 0;
      abStack_e8[0x26] = 0;
      abStack_e8[0x27] = 0;
      abStack_e8[8] = 0;
      abStack_e8[9] = 0;
      abStack_e8[10] = 0;
      abStack_e8[0xb] = 0;
      abStack_e8[0xc] = 0;
      abStack_e8[0xd] = 0;
      abStack_e8[0xe] = 0;
      abStack_e8[0xf] = 0;
      abStack_e8[0x10] = 0;
      abStack_e8[0x11] = 0;
      abStack_e8[0x12] = 0;
      abStack_e8[0x13] = 0;
      abStack_e8[0x14] = 0;
      abStack_e8[0x15] = 0;
      abStack_e8[0x16] = 0;
      abStack_e8[0x17] = 0;
      local_f0.internalTimeCode = 0;
      abStack_e8[0] = 0;
      abStack_e8[1] = 0;
      abStack_e8[2] = 0;
      abStack_e8[3] = 0;
      abStack_e8[4] = 0;
      abStack_e8[5] = 0;
      abStack_e8[6] = 0;
      abStack_e8[7] = 0;
      local_100.internalTimeCode = 0;
      TStack_f8.internalTimeCode = 0;
      local_128._24_8_ = 0;
      TStack_108.internalTimeCode = 0;
      local_a0 = 0x40;
      local_98 = abStack_e8;
      local_80 = (pointer)0x0;
      pbStack_78 = (pointer)0x0;
      local_90._0_1_ = false;
      local_90._1_1_ = false;
      local_90._2_1_ = false;
      local_90._3_1_ = '\0';
      local_90._4_4_ = 0;
      pbStack_88 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_298,local_130);
      uVar4 = local_298._0_4_;
      act = (ActionMessage *)(local_298 + 8);
      pAVar14 = act;
      ActionMessage::operator=((ActionMessage *)local_128,act);
      iVar6 = (int)pAVar14;
      ActionMessage::~ActionMessage(act);
      if ((((local_128._0_4_ == cmd_protocol_priority) || (local_128._0_4_ == cmd_protocol_big)) ||
          (local_128._0_4_ == cmd_protocol)) && (uVar4 == 0xffffffff)) {
        iVar7 = 2;
        if ((int)local_128._4_4_ < 0x14d) {
          if (local_128._4_4_ == 0xe9) {
            local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_320,local_98,(byte *)((long)pvStack_a8 + (long)local_98));
            gmlc::networking::extractInterfaceAndPort
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)local_298,(string *)&local_320);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
            zmq::socket_t::socket_t
                      ((socket_t *)&local_2e8,
                       *(context_t **)(local_1d8.name._M_dataplus._M_p + 0x20),8);
            local_320._M_dataplus._M_p._0_4_ = 100;
            sVar9 = 4;
            zmq::detail::socket_base::setsockopt
                      ((socket_base *)&local_2e8,0x11,(int)(string *)&local_320,4,pvVar24,
                       (socklen_t)in_R9);
            gmlc::networking::makePortAddress((string *)&local_320,(string *)local_298,local_278);
            zmq::detail::socket_base::connect
                      ((socket_base *)&local_2e8,(int)local_320._M_dataplus._M_p,__addr_02,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
            local_320._M_dataplus._M_p._0_4_ = local_128._20_4_;
            pbVar8 = &local_320;
            std::
            _Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
            ::_M_emplace_unique<helics::route_id,zmq::socket_t>
                      ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
                        *)local_1a8,(route_id *)pbVar8,(socket_t *)&local_2e8);
            iVar6 = (int)pbVar8;
            zmq::socket_t::close((socket_t *)&local_2e8,iVar6);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              uVar18 = local_298._16_8_ + 1;
              operator_delete((void *)local_298._0_8_,uVar18);
              iVar6 = (int)uVar18;
            }
          }
          else {
            if (local_128._4_4_ != 0xf4) goto LAB_00274091;
            local_298._0_4_ = local_128._20_4_;
            pVar25 = std::
                     _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                     ::equal_range((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                                    *)local_1a8,(key_type *)local_298);
            __first._M_node = (_Base_ptr)pVar25.first._M_node;
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
            ::_M_erase_aux((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                            *)local_1a8,__first,(_Base_ptr)pVar25.second._M_node);
            iVar6 = (int)__first._M_node;
          }
          goto LAB_002741bd;
        }
        if (local_128._4_4_ == 0x14d) {
          zmq::socket_t::close(&local_2f8,iVar6);
          context_ = *(context_t **)(local_1d8.name._M_dataplus._M_p + 0x20);
          zmq::socket_t::socket_t((socket_t *)local_298,context_,8);
          sVar3._handle = local_2f8.super_socket_base._handle;
          local_2f8.super_socket_base._handle = (void *)local_298._0_8_;
          local_298._0_8_ = sVar3._handle;
          zmq::socket_t::close((socket_t *)local_298,(int)context_);
          local_298._0_4_ = 200;
          zmq::detail::socket_base::setsockopt
                    (&local_2f8.super_socket_base,0x11,
                     (int)(pair<helics::route_id,_helics::ActionMessage> *)local_298,4,pvVar24,
                     (socklen_t)in_R9);
          pbVar8 = local_138;
          this = (ZmqComms *)local_300;
          pbVar13 = local_98;
          pvVar24 = pvStack_a8;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(local_138,0,(local_300->brokerTargetAddress)._M_string_length,(char *)local_98,
                     (size_type)pvStack_a8);
          sVar9 = (socklen_t)pbVar13;
          *(undefined4 *)&((CommsInterface *)((long)this + 0x410))->_vptr_CommsInterface =
               local_128._20_4_;
          gmlc::networking::makePortAddress((string *)local_298,(string *)pbVar8,local_128._20_4_);
          zmq::detail::socket_base::connect
                    (&local_2f8.super_socket_base,(int)local_298._0_8_,__addr_01,sVar9);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
LAB_00274091:
          if (((CommsInterface *)this)->useJsonSerialization == true) goto LAB_0027409e;
          ActionMessage::to_vector((ActionMessage *)local_128,&local_2b8);
          goto LAB_00274160;
        }
        if (local_128._4_4_ == 0x7cd) {
          CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
          goto LAB_00274091;
        }
        bVar2 = true;
        if (local_128._4_4_ != 0x9db) goto LAB_00274091;
      }
      else {
        if ((uVar4 & 0xff000000) != 0xa000000) goto LAB_00274091;
LAB_0027409e:
        ActionMessage::to_json_string_abi_cxx11_((string *)local_298,(ActionMessage *)local_128);
        std::vector<char,_std::allocator<char>_>::resize(&local_2b8,local_298._8_8_);
        if (local_298._8_8_ != 0) {
          memmove(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,(void *)local_298._0_8_,local_298._8_8_);
        }
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
LAB_00274160:
        __flags = (int)pvVar24;
        iVar7 = (int)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        if (uVar4 == 0xffffffff) {
          pcVar15 = local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          zmq::detail::socket_base::send
                    (&local_2c8.super_socket_base,iVar7,
                     local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                     -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,1,__flags);
          iVar6 = (int)pcVar15;
LAB_002741bd:
          iVar7 = 2;
          bVar2 = false;
        }
        else {
          if (uVar4 == 0) {
            if (((((CommsInterface *)((long)this + 0x410))->rxTrigger).triggered._M_base._M_i & 1U)
                == 0) {
              bVar2 = false;
              message._M_str = "no route to broker for message";
              message._M_len = 0x1e;
              iVar6 = 0x1e;
              CommsInterface::logWarning((CommsInterface *)this,message);
              iVar7 = 0;
            }
            else {
              bVar2 = false;
              pcVar15 = local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              zmq::detail::socket_base::send
                        (&local_2f8.super_socket_base,iVar7,
                         local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,0,__flags);
              iVar6 = (int)pcVar15;
              iVar7 = 0;
            }
            goto LAB_00274662;
          }
          puVar19 = (undefined1 *)local_1a8._16_8_;
          if ((undefined1 *)local_1a8._16_8_ == (undefined1 *)0x0) {
LAB_0027421b:
            iVar6 = (int)puVar19;
            psVar23 = &local_2f8;
            if (((((CommsInterface *)((long)this + 0x410))->rxTrigger).triggered._M_base._M_i & 1U)
                == 0) {
              bVar5 = isIgnoreableCommand((ActionMessage *)local_128);
              bVar2 = false;
              iVar7 = 0;
              if (bVar5) goto LAB_00274662;
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_320,"unknown route and no broker, dropping message ","");
              prettyPrintString_abi_cxx11_(&local_2e8,(helics *)local_128,command);
              uVar22 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                uVar22 = local_320.field_2._M_allocated_capacity;
              }
              pvVar24 = (void *)local_320._M_string_length;
              if ((ulong)uVar22 < local_2e8._M_string_length + local_320._M_string_length) {
                in_R9 = &local_2e8.field_2;
                uVar22 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p != in_R9) {
                  uVar22 = local_2e8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar22 < local_2e8._M_string_length + local_320._M_string_length)
                goto LAB_002742db;
                pbVar8 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                   (&local_2e8,0,0,local_320._M_dataplus._M_p,
                                    local_320._M_string_length);
              }
              else {
LAB_002742db:
                pbVar8 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_320,local_2e8._M_dataplus._M_p,local_2e8._M_string_length)
                ;
              }
              local_298._0_8_ = (pbVar8->_M_dataplus)._M_p;
              paVar10 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._0_8_ == paVar10) {
                local_298._16_8_ = paVar10->_M_allocated_capacity;
                local_298._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_298._0_8_ = local_298 + 0x10;
              }
              else {
                local_298._16_8_ = paVar10->_M_allocated_capacity;
              }
              sVar16 = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar8->_M_string_length = 0;
              paVar10->_M_local_buf[0] = '\0';
              message_00._M_str = (char *)local_298._0_8_;
              message_00._M_len = sVar16;
              local_298._8_8_ = sVar16;
              CommsInterface::logWarning((CommsInterface *)this,message_00);
              iVar6 = (int)sVar16;
              if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                uVar18 = local_298._16_8_ + 1;
                operator_delete((void *)local_298._0_8_,uVar18);
                iVar6 = (int)uVar18;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                uVar18 = local_2e8.field_2._M_allocated_capacity + 1;
                operator_delete(local_2e8._M_dataplus._M_p,uVar18);
                iVar6 = (int)uVar18;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                uVar18 = local_320.field_2._M_allocated_capacity + 1;
                operator_delete(local_320._M_dataplus._M_p,uVar18);
                iVar6 = (int)uVar18;
              }
              bVar2 = false;
              iVar7 = 0;
              goto LAB_00274662;
            }
          }
          else {
            puVar21 = local_1a8 + 8;
            do {
              puVar20 = puVar21;
              puVar12 = puVar19;
              iVar6 = *(int *)(puVar12 + 0x20);
              puVar21 = puVar12;
              if (iVar6 < (int)uVar4) {
                puVar21 = puVar20;
              }
              puVar19 = *(undefined1 **)(puVar12 + ((ulong)(iVar6 < (int)uVar4) * 2 + 4) * 4);
            } while (*(undefined1 **)(puVar12 + ((ulong)(iVar6 < (int)uVar4) * 2 + 4) * 4) !=
                     (undefined1 *)0x0);
            puVar19 = local_1a8 + 8;
            if (puVar21 == puVar19) goto LAB_0027421b;
            if (iVar6 < (int)uVar4) {
              puVar12 = puVar20;
            }
            if ((int)uVar4 < *(int *)(puVar12 + 0x20)) goto LAB_0027421b;
            psVar23 = (socket_t *)(puVar21 + 0x28);
          }
          bVar2 = false;
          pcVar15 = local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          zmq::detail::socket_base::send
                    (&psVar23->super_socket_base,iVar7,
                     local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                     -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,0,__flags);
          iVar6 = (int)pcVar15;
          iVar7 = 0;
        }
      }
LAB_00274662:
      ActionMessage::~ActionMessage((ActionMessage *)local_128);
    } while ((iVar7 != 3) && (!bVar2));
    zmq::socket_t::close(&local_2f8,iVar6);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::clear((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
             *)local_1a8);
    if ((((CommsInterface *)this)->rxStatus)._M_i == CONNECTED) {
      local_298._0_8_ = local_298 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"close","");
      pcVar17 = (pointer)local_298._0_8_;
      iVar7 = zmq_send(local_2c8.super_socket_base._handle,local_298._0_8_,local_298._8_8_,1);
      iVar6 = (int)pcVar17;
      if ((iVar7 < 0) && (iVar7 = zmq_errno(), iVar7 != 0xb)) {
        this_00 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(this_00);
        __cxa_throw(this_00,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        uVar18 = local_298._16_8_ + 1;
        operator_delete((void *)local_298._0_8_,uVar18);
        iVar6 = (int)uVar18;
      }
    }
    zmq::socket_t::close(&local_2c8,iVar6);
    status = TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
    zmq_msg_close(local_70);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::~_Rb_tree((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                 *)local_1a8);
    psVar23 = &local_2f8;
  }
  zmq::socket_t::close(psVar23,status);
  if ((unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)
      local_1d8.name.field_2._M_allocated_capacity != &local_1d8.zcontext) {
    puVar19 = (undefined1 *)
              ((long)(void **)local_1d8.zcontext._M_t.
                              super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>
                              .super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl + 1);
    operator_delete((void *)local_1d8.name.field_2._M_allocated_capacity,(ulong)puVar19);
    status = (ConnectionStatus)puVar19;
  }
  zmq::socket_t::close(&local_2c8,status);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8.name._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8.name._M_string_length);
  }
  if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ZmqComms::queue_tx_function()
{
    std::vector<char> buffer;
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    // Setup the control socket for comms with the receiver
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    controlSocket.setsockopt(ZMQ_LINGER, 200);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    controlSocket.connect(controlsockString);
    try {
        auto res = initializeBrokerConnections(controlSocket);
        if (res < 0) {
            setTxStatus((res != -3) ? ConnectionStatus::ERRORED : ConnectionStatus::TERMINATED);

            controlSocket.close();
            return;
        }
    }
    catch (const zmq::error_t&) {
        controlSocket.close();
        return;
    }

    zmq::socket_t brokerPushSocket(ctx->getBaseContext(), ZMQ_PUSH);
    brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
    std::map<route_id, zmq::socket_t> routes;  // for all the other possible routes
    // ZmqRequestSets priority_routes;  //!< object to handle the management of the priority
    // routes

    if (hasBroker) {
        //   priority_routes.addRoutes (0, makePortAddress (brokerTargetAddress, brokerPort+1));
        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
    }
    setTxStatus(ConnectionStatus::CONNECTED);
    zmq::message_t msg;
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (control_route == rid) {
                switch (cmd.messageID) {
                    case RECONNECT_TRANSMITTER:
                        setTxStatus(ConnectionStatus::CONNECTED);
                        break;
                    case NEW_BROKER_INFORMATION:
                        brokerPushSocket.close();
                        brokerPushSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                        brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
                        brokerTargetAddress = cmd.payload.to_string();
                        brokerPort = cmd.getExtraData();
                        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
                        break;
                    case NEW_ROUTE: {
                        try {
                            auto interfaceAndPort = gmlc::networking::extractInterfaceAndPort(
                                std::string(cmd.payload.to_string()));

                            auto zsock = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                            zsock.setsockopt(ZMQ_LINGER, 100);
                            zsock.connect(
                                makePortAddress(interfaceAndPort.first, interfaceAndPort.second));
                            routes.emplace(route_id{cmd.getExtraData()}, std::move(zsock));
                        }
                        catch (const zmq::error_t& e) {
                            // TODO(PT): do something???
                            logError(std::string("unable to connect route") +
                                     std::string(cmd.payload.to_string()) + "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }
        if (getRouteTypeCode(rid) == json_route_code || useJsonSerialization) {
            auto str = cmd.to_json_string();
            buffer.resize(str.size());
            std::copy(str.begin(), str.end(), buffer.begin());

        } else {
            cmd.to_vector(buffer);
        }
        if (rid == parent_route_id) {
            if (hasBroker) {
                brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                      zmq::send_flags::none);
            } else {
                logWarning("no route to broker for message");
            }
        } else if (rid == control_route) {  // send to rx thread loop
            try {
                controlSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                   zmq::send_flags::dontwait);
            }
            catch (const zmq::error_t& e) {
                if ((getRxStatus() == ConnectionStatus::TERMINATED) ||
                    (getRxStatus() == ConnectionStatus::ERRORED)) {
                    break;
                }
                logError(e.what());
            }
            continue;
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                rt_find->second.send(zmq::const_buffer(buffer.data(), buffer.size()));
            } else {
                if (hasBroker) {
                    brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()));
                } else {
                    if (!isIgnoreableCommand(cmd)) {
                        logWarning(std::string("unknown route and no broker, dropping message ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    brokerPushSocket.close();

    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        try {
            controlSocket.send(std::string("close"), zmq::send_flags::dontwait);
        }
        catch (const zmq::error_t&) {
            // this probably just means it got closed simultaneously which would be unusual but
            // not impossible
        }
    }

    controlSocket.close();

    setTxStatus(ConnectionStatus::TERMINATED);
}